

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall
args::PositionalList<double,_args::detail::vector,_args::ValueReader>::~PositionalList
          (PositionalList<double,_args::detail::vector,_args::ValueReader> *this)

{
  pointer pdVar1;
  
  (this->super_PositionalBase).super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&PTR__PositionalList_0021cc20;
  pdVar1 = (this->defaultValues).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  pdVar1 = (this->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  NamedBase::~NamedBase((NamedBase *)this);
  return;
}

Assistant:

virtual ~PositionalList() {}